

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrAsciiOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  char **ppcVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  char **local_88;
  anon_union_16_2_67f50693_for_value local_70;
  ulong local_60;
  ulong local_58;
  anon_union_16_2_67f50693_for_value local_50;
  ValidityMask *local_40;
  ulong local_38;
  
  local_58 = count;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = *(undefined8 *)&ldata->value;
      pcVar4 = (ldata->value).pointer.ptr;
      local_88 = &(rdata->value).pointer.ptr;
      iVar5 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_50._0_4_ = paVar1->length;
        local_50._4_1_ = paVar1->prefix[0];
        local_50._5_1_ = paVar1->prefix[1];
        local_50._6_1_ = paVar1->prefix[2];
        local_50._7_1_ = paVar1->prefix[3];
        local_50.pointer.ptr = *local_88;
        local_70._0_8_ = uVar3;
        local_70.pointer.ptr = pcVar4;
        iVar6 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_50.pointer);
        result_data[iVar5] = iVar6 + 1;
        iVar5 = iVar5 + 1;
        local_88 = local_88 + 2;
      } while (local_58 != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_38 = 0;
    uVar9 = 0;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar11 = 0xffffffffffffffff;
      }
      else {
        uVar11 = puVar2[local_38];
      }
      uVar7 = uVar9 + 0x40;
      if (local_58 <= uVar9 + 0x40) {
        uVar7 = local_58;
      }
      uVar10 = uVar7;
      if (uVar11 != 0) {
        uVar10 = uVar9;
        if (uVar11 == 0xffffffffffffffff) {
          if (uVar9 < uVar7) {
            uVar3 = *(undefined8 *)&ldata->value;
            pcVar4 = (ldata->value).pointer.ptr;
            ppcVar8 = &rdata[uVar9].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
              local_50._0_4_ = paVar1->length;
              local_50._4_1_ = paVar1->prefix[0];
              local_50._5_1_ = paVar1->prefix[1];
              local_50._6_1_ = paVar1->prefix[2];
              local_50._7_1_ = paVar1->prefix[3];
              local_50.pointer.ptr = *ppcVar8;
              local_70._0_8_ = uVar3;
              local_70.pointer.ptr = pcVar4;
              iVar5 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_50.pointer);
              result_data[uVar10] = iVar5 + 1;
              uVar10 = uVar10 + 1;
              ppcVar8 = ppcVar8 + 2;
            } while (uVar7 != uVar10);
          }
        }
        else if (uVar9 < uVar7) {
          ppcVar8 = &rdata[uVar9].value.pointer.ptr;
          uVar10 = 0;
          do {
            if ((uVar11 >> (uVar10 & 0x3f) & 1) != 0) {
              local_70._0_8_ = *(undefined8 *)&ldata->value;
              local_70.pointer.ptr = (ldata->value).pointer.ptr;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
              local_50._0_4_ = paVar1->length;
              local_50._4_1_ = paVar1->prefix[0];
              local_50._5_1_ = paVar1->prefix[1];
              local_50._6_1_ = paVar1->prefix[2];
              local_50._7_1_ = paVar1->prefix[3];
              local_50.pointer.ptr = *ppcVar8;
              iVar5 = FindStrInStr((string_t *)&local_70.pointer,(string_t *)&local_50.pointer);
              result_data[uVar9 + uVar10] = iVar5 + 1;
            }
            uVar10 = uVar10 + 1;
            ppcVar8 = ppcVar8 + 2;
          } while ((uVar9 - uVar7) + uVar10 != 0);
          uVar10 = uVar9 + uVar10;
        }
      }
      local_38 = local_38 + 1;
      uVar9 = uVar10;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}